

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O2

size_t ZSTD_compressBlock_doubleFast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  uint uVar1;
  long *iEnd;
  BYTE *pBVar2;
  undefined8 *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  BYTE *pBVar9;
  ZSTD_matchState_t *pZVar10;
  BYTE *pBVar11;
  long *mEnd;
  U32 *pUVar12;
  U32 *pUVar13;
  U32 *pUVar14;
  U32 *pUVar15;
  uint uVar16;
  undefined8 uVar17;
  char cVar18;
  char cVar19;
  long *plVar20;
  long *plVar21;
  ulong uVar22;
  size_t sVar23;
  byte bVar24;
  byte bVar26;
  byte bVar27;
  ulong uVar28;
  long lVar29;
  uint uVar30;
  seqDef *psVar31;
  long *plVar32;
  ulong uVar33;
  int *piVar34;
  BYTE *pBVar35;
  ulong uVar36;
  uint uVar37;
  ulong uVar38;
  int iVar39;
  uint uVar40;
  long *iStart;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  U32 UVar44;
  BYTE *litEnd_2;
  U32 UVar46;
  BYTE *litEnd;
  long *plVar47;
  long *plVar48;
  long *plVar49;
  long *plVar50;
  uint local_134;
  long *local_130;
  uint local_124;
  BYTE *litLimit_w;
  char *_ptr;
  byte bVar25;
  int iVar45;
  
  pBVar9 = (ms->window).base;
  iEnd = (long *)((long)src + srcSize);
  iVar39 = (int)pBVar9;
  uVar41 = (int)iEnd - iVar39;
  uVar42 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar4 = (ms->window).dictLimit;
  uVar16 = uVar41 - uVar42;
  if (uVar41 - uVar4 <= uVar42) {
    uVar16 = uVar4;
  }
  if (ms->loadedDictEnd != 0) {
    uVar16 = uVar4;
  }
  pZVar10 = ms->dictMatchState;
  uVar5 = (pZVar10->window).dictLimit;
  pBVar11 = (pZVar10->window).base;
  plVar32 = (long *)(pBVar11 + uVar5);
  iStart = (long *)(pBVar9 + uVar16);
  uVar42 = uVar42 + uVar4;
  plVar20 = (long *)((long)src + (srcSize - 8));
  mEnd = (long *)(pZVar10->window).nextSrc;
  uVar30 = ((int)pBVar11 - (int)mEnd) + uVar16;
  pUVar12 = pZVar10->hashTable;
  pUVar13 = pZVar10->chainTable;
  uVar6 = (pZVar10->cParams).hashLog;
  uVar43 = (pZVar10->cParams).chainLog;
  uVar40 = ((int)src - ((int)plVar32 + (int)iStart)) + (int)mEnd;
  uVar37 = (ms->cParams).minMatch;
  pUVar14 = ms->hashTable;
  uVar7 = (ms->cParams).hashLog;
  pUVar15 = ms->chainTable;
  uVar8 = (ms->cParams).chainLog;
  local_134 = *rep;
  local_124 = rep[1];
  uVar4 = uVar6 + 8;
  uVar1 = uVar43 + 8;
  uVar33 = (ulong)uVar30;
  bVar24 = (byte)uVar6;
  bVar25 = (byte)uVar43;
  cVar18 = (char)uVar7;
  cVar19 = (char)uVar8;
  if (uVar37 == 5) {
    if (uVar42 < uVar41) goto LAB_0063571c;
    if (ms->prefetchCDictTables != 0) {
      for (uVar28 = 0; uVar28 < (ulong)(4L << (bVar24 & 0x3f)); uVar28 = uVar28 + 0x40) {
      }
      for (uVar28 = 0; uVar28 < (ulong)(4L << (bVar25 & 0x3f)); uVar28 = uVar28 + 0x40) {
      }
    }
    if (uVar40 < local_134) goto LAB_0063573b;
    if (local_124 <= uVar40) {
      plVar47 = (long *)((long)src + (ulong)(uVar40 == 0));
      bVar26 = 0x40 - cVar18;
      bVar27 = 0x40 - cVar19;
      plVar21 = iEnd + -4;
      local_130 = (long *)src;
LAB_0063353a:
      if (plVar47 < plVar20) {
        if (0x20 < uVar7) goto LAB_00635605;
        lVar29 = *plVar47;
        uVar28 = (ulong)(lVar29 * -0x30e44323485a9b9d) >> (bVar26 & 0x3f);
        if (0x20 < uVar8) goto LAB_00635605;
        uVar38 = (ulong)(lVar29 * -0x30e4432345000000) >> (bVar27 & 0x3f);
        if ((0x20 < uVar4) || (0x20 < uVar1)) goto LAB_00635605;
        uVar36 = (ulong)(lVar29 * -0x30e44323485a9b9d) >> (0x38 - bVar24 & 0x3f);
        uVar22 = (ulong)(lVar29 * -0x30e4432345000000) >> (0x38 - bVar25 & 0x3f);
        uVar41 = pUVar12[uVar36 >> 8];
        uVar42 = pUVar13[uVar22 >> 8];
        iVar45 = (int)plVar47;
        UVar44 = iVar45 - iVar39;
        uVar6 = pUVar14[uVar28];
        uVar43 = pUVar15[uVar38];
        UVar46 = UVar44 + 1;
        pUVar15[uVar38] = UVar44;
        uVar37 = UVar46 - local_134;
        pUVar14[uVar28] = UVar44;
        if ((uVar16 - 1) - uVar37 < 3) {
LAB_0063367c:
          if (uVar16 < uVar6) {
            plVar49 = (long *)(pBVar9 + uVar6);
            if (*plVar49 != lVar29) goto LAB_006336c5;
            sVar23 = ZSTD_count((BYTE *)(plVar47 + 1),(BYTE *)(plVar49 + 1),(BYTE *)iEnd);
            uVar28 = sVar23 + 8;
            uVar43 = iVar45 - (int)plVar49;
            for (; ((iStart < plVar49 && (local_130 < plVar47)) &&
                   (*(char *)((long)plVar47 + -1) == *(char *)((long)plVar49 + -1)));
                plVar47 = (long *)((long)plVar47 + -1)) {
              plVar49 = (long *)((long)plVar49 + -1);
              uVar28 = uVar28 + 1;
            }
            goto LAB_00633c01;
          }
          if ((char)uVar36 == (char)uVar41) {
            uVar41 = uVar41 >> 8;
            plVar49 = (long *)(pBVar11 + uVar41);
            if (mEnd <= plVar49) goto LAB_006356bf;
            if ((uVar5 < uVar41) && (*plVar49 == lVar29)) {
              sVar23 = ZSTD_count_2segments
                                 ((BYTE *)(plVar47 + 1),(BYTE *)(plVar49 + 1),(BYTE *)iEnd,
                                  (BYTE *)mEnd,(BYTE *)iStart);
              uVar28 = sVar23 + 8;
              uVar43 = UVar44 - (uVar41 + uVar30);
              for (; ((plVar32 < plVar49 && (local_130 < plVar47)) &&
                     (*(char *)((long)plVar47 + -1) == *(char *)((long)plVar49 + -1)));
                  plVar47 = (long *)((long)plVar47 + -1)) {
                plVar49 = (long *)((long)plVar49 + -1);
                uVar28 = uVar28 + 1;
              }
              goto LAB_00633c01;
            }
          }
LAB_006336c5:
          if (uVar16 < uVar43) {
            plVar49 = (long *)(pBVar9 + uVar43);
            if ((int)*plVar49 == (int)*plVar47) {
LAB_006339c4:
              lVar29 = *(long *)((long)plVar47 + 1);
              uVar38 = (ulong)(lVar29 * -0x30e44323485a9b9d) >> (bVar26 & 0x3f);
              uVar28 = (ulong)(lVar29 * -0x30e44323485a9b9d) >> (0x38 - bVar24 & 0x3f);
              plVar48 = (long *)((long)plVar47 + 1);
              uVar41 = pUVar14[uVar38];
              uVar42 = pUVar12[uVar28 >> 8];
              pUVar14[uVar38] = UVar46;
              if (uVar16 < uVar41) {
                plVar50 = (long *)(pBVar9 + uVar41);
                if (*plVar50 != lVar29) goto LAB_00633b3f;
                sVar23 = ZSTD_count((BYTE *)((long)plVar47 + 9),(BYTE *)(plVar50 + 1),(BYTE *)iEnd);
                uVar28 = sVar23 + 8;
                uVar43 = (int)plVar48 - (int)plVar50;
                for (; ((plVar47 = plVar48, iStart < plVar50 && (local_130 < plVar48)) &&
                       (*(char *)((long)plVar48 + -1) == *(char *)((long)plVar50 + -1)));
                    plVar48 = (long *)((long)plVar48 + -1)) {
                  plVar50 = (long *)((long)plVar50 + -1);
                  uVar28 = uVar28 + 1;
                }
              }
              else {
                if ((char)uVar28 == (char)uVar42) {
                  uVar42 = uVar42 >> 8;
                  plVar50 = (long *)(pBVar11 + uVar42);
                  if (mEnd <= plVar50) goto LAB_006357b7;
                  if ((uVar5 < uVar42) && (*plVar50 == lVar29)) {
                    sVar23 = ZSTD_count_2segments
                                       ((BYTE *)((long)plVar47 + 9),(BYTE *)(plVar50 + 1),
                                        (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
                    uVar28 = sVar23 + 8;
                    uVar43 = UVar46 - (uVar42 + uVar30);
                    for (; ((plVar47 = plVar48, plVar32 < plVar50 && (local_130 < plVar48)) &&
                           (*(char *)((long)plVar48 + -1) == *(char *)((long)plVar50 + -1)));
                        plVar48 = (long *)((long)plVar48 + -1)) {
                      plVar50 = (long *)((long)plVar50 + -1);
                      uVar28 = uVar28 + 1;
                    }
                    goto LAB_00633c01;
                  }
                }
LAB_00633b3f:
                if (uVar43 < uVar16) {
                  sVar23 = ZSTD_count_2segments
                                     ((BYTE *)((long)plVar47 + 4),(BYTE *)((long)plVar49 + 4),
                                      (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
                  uVar28 = sVar23 + 4;
                  uVar43 = UVar44 - uVar43;
                  for (; ((plVar32 < plVar49 && (local_130 < plVar47)) &&
                         (*(char *)((long)plVar47 + -1) == *(char *)((long)plVar49 + -1)));
                      plVar47 = (long *)((long)plVar47 + -1)) {
                    plVar49 = (long *)((long)plVar49 + -1);
                    uVar28 = uVar28 + 1;
                  }
                }
                else {
                  sVar23 = ZSTD_count((BYTE *)((long)plVar47 + 4),(BYTE *)((long)plVar49 + 4),
                                      (BYTE *)iEnd);
                  uVar28 = sVar23 + 4;
                  uVar43 = iVar45 - (int)plVar49;
                  for (; ((iStart < plVar49 && (local_130 < plVar47)) &&
                         (*(char *)((long)plVar47 + -1) == *(char *)((long)plVar49 + -1)));
                      plVar47 = (long *)((long)plVar47 + -1)) {
                    plVar49 = (long *)((long)plVar49 + -1);
                    uVar28 = uVar28 + 1;
                  }
                }
              }
LAB_00633c01:
              if (uVar43 != 0) {
                if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                    seqStore->maxNbSeq) {
                  if (seqStore->maxNbLit < 0x20001) {
                    uVar38 = (long)plVar47 - (long)local_130;
                    plVar49 = (long *)seqStore->lit;
                    if ((BYTE *)((long)plVar49 + uVar38) <= seqStore->litStart + seqStore->maxNbLit)
                    {
                      if (plVar47 <= iEnd) {
                        if (plVar21 < plVar47) {
                          ZSTD_safecopyLiterals
                                    ((BYTE *)plVar49,(BYTE *)local_130,(BYTE *)plVar47,
                                     (BYTE *)plVar21);
LAB_00633c71:
                          seqStore->lit = seqStore->lit + uVar38;
                          if (0xffff < uVar38) {
                            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00635779;
                            seqStore->longLengthType = ZSTD_llt_literalLength;
                            seqStore->longLengthPos =
                                 (U32)((ulong)((long)seqStore->sequences -
                                              (long)seqStore->sequencesStart) >> 3);
                          }
                        }
                        else {
                          lVar29 = local_130[1];
                          *plVar49 = *local_130;
                          plVar49[1] = lVar29;
                          pBVar35 = seqStore->lit;
                          if (0x10 < uVar38) {
                            if ((ulong)((long)(pBVar35 + 0x10) + (-0x10 - (long)(local_130 + 2))) <
                                0xffffffffffffffe1) {
                              lVar29 = local_130[3];
                              *(long *)(pBVar35 + 0x10) = local_130[2];
                              *(long *)(pBVar35 + 0x18) = lVar29;
                              if (0x20 < (long)uVar38) {
                                lVar29 = 0;
                                do {
                                  puVar3 = (undefined8 *)((long)local_130 + lVar29 + 0x20);
                                  uVar17 = puVar3[1];
                                  pBVar2 = pBVar35 + lVar29 + 0x20;
                                  *(undefined8 *)pBVar2 = *puVar3;
                                  *(undefined8 *)(pBVar2 + 8) = uVar17;
                                  puVar3 = (undefined8 *)((long)local_130 + lVar29 + 0x30);
                                  uVar17 = puVar3[1];
                                  *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                                  *(undefined8 *)(pBVar2 + 0x18) = uVar17;
                                  lVar29 = lVar29 + 0x20;
                                } while (pBVar2 + 0x20 < pBVar35 + uVar38);
                              }
                              goto LAB_00633c71;
                            }
                            goto LAB_00635798;
                          }
                          seqStore->lit = pBVar35 + uVar38;
                        }
                        psVar31 = seqStore->sequences;
                        psVar31->litLength = (U16)uVar38;
                        psVar31->offBase = uVar43 + 3;
                        if (2 < uVar28) {
                          uVar38 = uVar28 - 3;
                          if (uVar38 < 0x10000) {
                            local_124 = local_134;
                            local_134 = uVar43;
                            goto LAB_00633d85;
                          }
                          local_124 = local_134;
                          local_134 = uVar43;
                          if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_00633d60;
                          goto LAB_006356de;
                        }
                        goto LAB_006356a0;
                      }
                      goto LAB_00635662;
                    }
                    goto LAB_00635643;
                  }
                  goto LAB_00635681;
                }
                goto LAB_00635624;
              }
              goto LAB_006356fd;
            }
          }
          else if ((char)uVar22 == (char)uVar42) {
            uVar42 = uVar42 >> 8;
            if ((uVar5 < uVar42) && (*(int *)(pBVar11 + uVar42) == (int)*plVar47)) {
              uVar43 = uVar42 + uVar30;
              plVar49 = (long *)(pBVar11 + uVar42);
              goto LAB_006339c4;
            }
          }
          plVar47 = (long *)((long)plVar47 + ((long)plVar47 - (long)local_130 >> 8) + 1);
        }
        else {
          piVar34 = (int *)(pBVar9 + uVar37);
          if (uVar37 < uVar16) {
            piVar34 = (int *)(pBVar11 + (uVar37 - uVar30));
          }
          if (*piVar34 != *(int *)((long)plVar47 + 1)) goto LAB_0063367c;
          plVar49 = iEnd;
          if (uVar37 < uVar16) {
            plVar49 = mEnd;
          }
          sVar23 = ZSTD_count_2segments
                             ((BYTE *)((long)plVar47 + 5),(BYTE *)(piVar34 + 1),(BYTE *)iEnd,
                              (BYTE *)plVar49,(BYTE *)iStart);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_00635624;
          if (0x20000 < seqStore->maxNbLit) goto LAB_00635681;
          plVar47 = (long *)((long)plVar47 + 1);
          uVar38 = (long)plVar47 - (long)local_130;
          plVar49 = (long *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar49 + uVar38))
          goto LAB_00635643;
          if (iEnd < plVar47) goto LAB_00635662;
          if (plVar21 < plVar47) {
            ZSTD_safecopyLiterals((BYTE *)plVar49,(BYTE *)local_130,(BYTE *)plVar47,(BYTE *)plVar21)
            ;
LAB_006337ec:
            seqStore->lit = seqStore->lit + uVar38;
            if (0xffff < uVar38) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00635779;
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            lVar29 = local_130[1];
            *plVar49 = *local_130;
            plVar49[1] = lVar29;
            pBVar35 = seqStore->lit;
            if (0x10 < uVar38) {
              if ((ulong)((long)(pBVar35 + 0x10) + (-0x10 - (long)(local_130 + 2))) <
                  0xffffffffffffffe1) {
                lVar29 = local_130[3];
                *(long *)(pBVar35 + 0x10) = local_130[2];
                *(long *)(pBVar35 + 0x18) = lVar29;
                if (0x20 < (long)uVar38) {
                  lVar29 = 0;
                  do {
                    puVar3 = (undefined8 *)((long)local_130 + lVar29 + 0x20);
                    uVar17 = puVar3[1];
                    pBVar2 = pBVar35 + lVar29 + 0x20;
                    *(undefined8 *)pBVar2 = *puVar3;
                    *(undefined8 *)(pBVar2 + 8) = uVar17;
                    puVar3 = (undefined8 *)((long)local_130 + lVar29 + 0x30);
                    uVar17 = puVar3[1];
                    *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                    *(undefined8 *)(pBVar2 + 0x18) = uVar17;
                    lVar29 = lVar29 + 0x20;
                  } while (pBVar2 + 0x20 < pBVar35 + uVar38);
                }
                goto LAB_006337ec;
              }
              goto LAB_00635798;
            }
            seqStore->lit = pBVar35 + uVar38;
          }
          uVar28 = sVar23 + 4;
          psVar31 = seqStore->sequences;
          psVar31->litLength = (U16)uVar38;
          psVar31->offBase = 1;
          if (uVar28 < 3) goto LAB_006356a0;
          uVar38 = sVar23 + 1;
          if (0xffff < uVar38) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_006356de;
LAB_00633d60:
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar31 - (long)seqStore->sequencesStart) >> 3);
          }
LAB_00633d85:
          plVar47 = (long *)(uVar28 + (long)plVar47);
          psVar31->mlBase = (U16)uVar38;
          psVar31 = psVar31 + 1;
          seqStore->sequences = psVar31;
          local_130 = plVar47;
          if (plVar47 <= plVar20) {
            uVar41 = UVar44 + 2;
            lVar29 = *(long *)(pBVar9 + uVar41);
            pUVar14[(ulong)(lVar29 * -0x30e44323485a9b9d) >> (bVar26 & 0x3f)] = uVar41;
            pUVar14[(ulong)(*(long *)((long)plVar47 + -2) * -0x30e44323485a9b9d) >> (bVar26 & 0x3f)]
                 = ((int)plVar47 + -2) - iVar39;
            pUVar15[(ulong)(lVar29 * -0x30e4432345000000) >> (bVar27 & 0x3f)] = uVar41;
            pUVar15[(ulong)(*(long *)((long)plVar47 + -1) * -0x30e4432345000000) >> (bVar27 & 0x3f)]
                 = ((int)plVar47 + -1) - iVar39;
            uVar41 = local_124;
            for (; local_124 = uVar41, local_130 = plVar47, plVar47 <= plVar20;
                plVar47 = (long *)((long)plVar47 + sVar23 + 4)) {
              UVar44 = (int)plVar47 - iVar39;
              uVar41 = UVar44 - local_124;
              pBVar35 = pBVar9;
              if (uVar41 < uVar16) {
                pBVar35 = pBVar11 + -uVar33;
              }
              if (((uVar16 - 1) - uVar41 < 3) || (*(int *)(pBVar35 + uVar41) != (int)*plVar47))
              break;
              plVar49 = iEnd;
              if (uVar41 < uVar16) {
                plVar49 = mEnd;
              }
              sVar23 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar47 + 4),(BYTE *)((long)(pBVar35 + uVar41) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)plVar49,(BYTE *)iStart);
              if (seqStore->maxNbSeq <= (ulong)((long)psVar31 - (long)seqStore->sequencesStart >> 3)
                 ) goto LAB_00635624;
              if (0x20000 < seqStore->maxNbLit) goto LAB_00635681;
              plVar49 = (long *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < plVar49) goto LAB_00635643;
              if (iEnd < plVar47) goto LAB_00635662;
              if (plVar21 < plVar47) {
                ZSTD_safecopyLiterals
                          ((BYTE *)plVar49,(BYTE *)plVar47,(BYTE *)plVar47,(BYTE *)plVar21);
              }
              else {
                lVar29 = plVar47[1];
                *plVar49 = *plVar47;
                plVar49[1] = lVar29;
              }
              psVar31 = seqStore->sequences;
              psVar31->litLength = 0;
              psVar31->offBase = 1;
              if (sVar23 + 4 < 3) goto LAB_006356a0;
              if (0xffff < sVar23 + 1) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_006356de;
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar31 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar31->mlBase = (U16)(sVar23 + 1);
              psVar31 = psVar31 + 1;
              seqStore->sequences = psVar31;
              lVar29 = *plVar47;
              pUVar15[(ulong)(lVar29 * -0x30e4432345000000) >> (bVar27 & 0x3f)] = UVar44;
              pUVar14[(ulong)(lVar29 * -0x30e44323485a9b9d) >> (bVar26 & 0x3f)] = UVar44;
              uVar41 = local_134;
              local_134 = local_124;
            }
          }
        }
        goto LAB_0063353a;
      }
      goto LAB_00634afa;
    }
  }
  else if (uVar37 == 6) {
    if (uVar42 < uVar41) goto LAB_0063571c;
    if (ms->prefetchCDictTables != 0) {
      for (uVar28 = 0; uVar28 < (ulong)(4L << (bVar24 & 0x3f)); uVar28 = uVar28 + 0x40) {
      }
      for (uVar28 = 0; uVar28 < (ulong)(4L << (bVar25 & 0x3f)); uVar28 = uVar28 + 0x40) {
      }
    }
    if (uVar40 < local_134) goto LAB_0063573b;
    if (local_124 <= uVar40) {
      plVar47 = (long *)((long)src + (ulong)(uVar40 == 0));
      bVar26 = 0x40 - cVar18;
      bVar27 = 0x40 - cVar19;
      plVar21 = iEnd + -4;
      local_130 = (long *)src;
LAB_006329e9:
      if (plVar47 < plVar20) {
        if (0x20 < uVar7) goto LAB_00635605;
        lVar29 = *plVar47;
        uVar28 = (ulong)(lVar29 * -0x30e44323485a9b9d) >> (bVar26 & 0x3f);
        if (0x20 < uVar8) goto LAB_00635605;
        uVar38 = (ulong)(lVar29 * -0x30e4432340650000) >> (bVar27 & 0x3f);
        if ((0x20 < uVar4) || (0x20 < uVar1)) goto LAB_00635605;
        uVar36 = (ulong)(lVar29 * -0x30e44323485a9b9d) >> (0x38 - bVar24 & 0x3f);
        uVar22 = (ulong)(lVar29 * -0x30e4432340650000) >> (0x38 - bVar25 & 0x3f);
        uVar41 = pUVar12[uVar36 >> 8];
        uVar42 = pUVar13[uVar22 >> 8];
        iVar45 = (int)plVar47;
        UVar44 = iVar45 - iVar39;
        uVar6 = pUVar14[uVar28];
        uVar43 = pUVar15[uVar38];
        UVar46 = UVar44 + 1;
        pUVar15[uVar38] = UVar44;
        uVar37 = UVar46 - local_134;
        pUVar14[uVar28] = UVar44;
        if ((uVar16 - 1) - uVar37 < 3) {
LAB_00632b2d:
          if (uVar16 < uVar6) {
            plVar49 = (long *)(pBVar9 + uVar6);
            if (*plVar49 != lVar29) goto LAB_00632bd0;
            sVar23 = ZSTD_count((BYTE *)(plVar47 + 1),(BYTE *)(plVar49 + 1),(BYTE *)iEnd);
            uVar28 = sVar23 + 8;
            uVar43 = iVar45 - (int)plVar49;
            for (; ((iStart < plVar49 && (local_130 < plVar47)) &&
                   (*(char *)((long)plVar47 + -1) == *(char *)((long)plVar49 + -1)));
                plVar47 = (long *)((long)plVar47 + -1)) {
              plVar49 = (long *)((long)plVar49 + -1);
              uVar28 = uVar28 + 1;
            }
            goto LAB_006330b4;
          }
          if ((char)uVar36 == (char)uVar41) {
            uVar41 = uVar41 >> 8;
            plVar49 = (long *)(pBVar11 + uVar41);
            if (mEnd <= plVar49) goto LAB_006356bf;
            if ((uVar5 < uVar41) && (*plVar49 == lVar29)) {
              sVar23 = ZSTD_count_2segments
                                 ((BYTE *)(plVar47 + 1),(BYTE *)(plVar49 + 1),(BYTE *)iEnd,
                                  (BYTE *)mEnd,(BYTE *)iStart);
              uVar28 = sVar23 + 8;
              uVar43 = UVar44 - (uVar41 + uVar30);
              for (; ((plVar32 < plVar49 && (local_130 < plVar47)) &&
                     (*(char *)((long)plVar47 + -1) == *(char *)((long)plVar49 + -1)));
                  plVar47 = (long *)((long)plVar47 + -1)) {
                plVar49 = (long *)((long)plVar49 + -1);
                uVar28 = uVar28 + 1;
              }
              goto LAB_006330b4;
            }
          }
LAB_00632bd0:
          if (uVar16 < uVar43) {
            plVar49 = (long *)(pBVar9 + uVar43);
            if ((int)*plVar49 == (int)*plVar47) {
LAB_00632bf5:
              lVar29 = *(long *)((long)plVar47 + 1);
              uVar38 = (ulong)(lVar29 * -0x30e44323485a9b9d) >> (bVar26 & 0x3f);
              uVar28 = (ulong)(lVar29 * -0x30e44323485a9b9d) >> (0x38 - bVar24 & 0x3f);
              plVar48 = (long *)((long)plVar47 + 1);
              uVar41 = pUVar14[uVar38];
              uVar42 = pUVar12[uVar28 >> 8];
              pUVar14[uVar38] = UVar46;
              if (uVar16 < uVar41) {
                plVar50 = (long *)(pBVar9 + uVar41);
                if (*plVar50 != lVar29) goto LAB_00632ea7;
                sVar23 = ZSTD_count((BYTE *)((long)plVar47 + 9),(BYTE *)(plVar50 + 1),(BYTE *)iEnd);
                uVar28 = sVar23 + 8;
                uVar43 = (int)plVar48 - (int)plVar50;
                for (; ((plVar47 = plVar48, iStart < plVar50 && (local_130 < plVar48)) &&
                       (*(char *)((long)plVar48 + -1) == *(char *)((long)plVar50 + -1)));
                    plVar48 = (long *)((long)plVar48 + -1)) {
                  plVar50 = (long *)((long)plVar50 + -1);
                  uVar28 = uVar28 + 1;
                }
              }
              else {
                if ((char)uVar28 == (char)uVar42) {
                  uVar42 = uVar42 >> 8;
                  plVar50 = (long *)(pBVar11 + uVar42);
                  if (mEnd <= plVar50) goto LAB_006357b7;
                  if ((uVar5 < uVar42) && (*plVar50 == lVar29)) {
                    sVar23 = ZSTD_count_2segments
                                       ((BYTE *)((long)plVar47 + 9),(BYTE *)(plVar50 + 1),
                                        (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
                    uVar28 = sVar23 + 8;
                    uVar43 = UVar46 - (uVar42 + uVar30);
                    for (; ((plVar47 = plVar48, plVar32 < plVar50 && (local_130 < plVar48)) &&
                           (*(char *)((long)plVar48 + -1) == *(char *)((long)plVar50 + -1)));
                        plVar48 = (long *)((long)plVar48 + -1)) {
                      plVar50 = (long *)((long)plVar50 + -1);
                      uVar28 = uVar28 + 1;
                    }
                    goto LAB_006330b4;
                  }
                }
LAB_00632ea7:
                if (uVar43 < uVar16) {
                  sVar23 = ZSTD_count_2segments
                                     ((BYTE *)((long)plVar47 + 4),(BYTE *)((long)plVar49 + 4),
                                      (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
                  uVar28 = sVar23 + 4;
                  uVar43 = UVar44 - uVar43;
                  for (; ((plVar32 < plVar49 && (local_130 < plVar47)) &&
                         (*(char *)((long)plVar47 + -1) == *(char *)((long)plVar49 + -1)));
                      plVar47 = (long *)((long)plVar47 + -1)) {
                    plVar49 = (long *)((long)plVar49 + -1);
                    uVar28 = uVar28 + 1;
                  }
                }
                else {
                  sVar23 = ZSTD_count((BYTE *)((long)plVar47 + 4),(BYTE *)((long)plVar49 + 4),
                                      (BYTE *)iEnd);
                  uVar28 = sVar23 + 4;
                  uVar43 = iVar45 - (int)plVar49;
                  for (; ((iStart < plVar49 && (local_130 < plVar47)) &&
                         (*(char *)((long)plVar47 + -1) == *(char *)((long)plVar49 + -1)));
                      plVar47 = (long *)((long)plVar47 + -1)) {
                    plVar49 = (long *)((long)plVar49 + -1);
                    uVar28 = uVar28 + 1;
                  }
                }
              }
LAB_006330b4:
              if (uVar43 != 0) {
                if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                    seqStore->maxNbSeq) {
                  if (seqStore->maxNbLit < 0x20001) {
                    uVar38 = (long)plVar47 - (long)local_130;
                    plVar49 = (long *)seqStore->lit;
                    if ((BYTE *)((long)plVar49 + uVar38) <= seqStore->litStart + seqStore->maxNbLit)
                    {
                      if (plVar47 <= iEnd) {
                        if (plVar21 < plVar47) {
                          ZSTD_safecopyLiterals
                                    ((BYTE *)plVar49,(BYTE *)local_130,(BYTE *)plVar47,
                                     (BYTE *)plVar21);
LAB_0063312b:
                          seqStore->lit = seqStore->lit + uVar38;
                          if (0xffff < uVar38) {
                            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00635779;
                            seqStore->longLengthType = ZSTD_llt_literalLength;
                            seqStore->longLengthPos =
                                 (U32)((ulong)((long)seqStore->sequences -
                                              (long)seqStore->sequencesStart) >> 3);
                          }
                        }
                        else {
                          lVar29 = local_130[1];
                          *plVar49 = *local_130;
                          plVar49[1] = lVar29;
                          pBVar35 = seqStore->lit;
                          if (0x10 < uVar38) {
                            if ((ulong)((long)(pBVar35 + 0x10) + (-0x10 - (long)(local_130 + 2))) <
                                0xffffffffffffffe1) {
                              lVar29 = local_130[3];
                              *(long *)(pBVar35 + 0x10) = local_130[2];
                              *(long *)(pBVar35 + 0x18) = lVar29;
                              if (0x20 < (long)uVar38) {
                                lVar29 = 0;
                                do {
                                  puVar3 = (undefined8 *)((long)local_130 + lVar29 + 0x20);
                                  uVar17 = puVar3[1];
                                  pBVar2 = pBVar35 + lVar29 + 0x20;
                                  *(undefined8 *)pBVar2 = *puVar3;
                                  *(undefined8 *)(pBVar2 + 8) = uVar17;
                                  puVar3 = (undefined8 *)((long)local_130 + lVar29 + 0x30);
                                  uVar17 = puVar3[1];
                                  *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                                  *(undefined8 *)(pBVar2 + 0x18) = uVar17;
                                  lVar29 = lVar29 + 0x20;
                                } while (pBVar2 + 0x20 < pBVar35 + uVar38);
                              }
                              goto LAB_0063312b;
                            }
                            goto LAB_00635798;
                          }
                          seqStore->lit = pBVar35 + uVar38;
                        }
                        psVar31 = seqStore->sequences;
                        psVar31->litLength = (U16)uVar38;
                        psVar31->offBase = uVar43 + 3;
                        if (2 < uVar28) {
                          uVar38 = uVar28 - 3;
                          if (uVar38 < 0x10000) {
                            local_124 = local_134;
                            local_134 = uVar43;
                            goto LAB_00633250;
                          }
                          local_124 = local_134;
                          local_134 = uVar43;
                          if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_0063322b;
                          goto LAB_006356de;
                        }
                        goto LAB_006356a0;
                      }
                      goto LAB_00635662;
                    }
                    goto LAB_00635643;
                  }
                  goto LAB_00635681;
                }
                goto LAB_00635624;
              }
              goto LAB_006356fd;
            }
          }
          else if ((char)uVar22 == (char)uVar42) {
            uVar42 = uVar42 >> 8;
            if ((uVar5 < uVar42) && (*(int *)(pBVar11 + uVar42) == (int)*plVar47)) {
              uVar43 = uVar42 + uVar30;
              plVar49 = (long *)(pBVar11 + uVar42);
              goto LAB_00632bf5;
            }
          }
          plVar47 = (long *)((long)plVar47 + ((long)plVar47 - (long)local_130 >> 8) + 1);
        }
        else {
          piVar34 = (int *)(pBVar9 + uVar37);
          if (uVar37 < uVar16) {
            piVar34 = (int *)(pBVar11 + (uVar37 - uVar30));
          }
          if (*piVar34 != *(int *)((long)plVar47 + 1)) goto LAB_00632b2d;
          plVar49 = iEnd;
          if (uVar37 < uVar16) {
            plVar49 = mEnd;
          }
          sVar23 = ZSTD_count_2segments
                             ((BYTE *)((long)plVar47 + 5),(BYTE *)(piVar34 + 1),(BYTE *)iEnd,
                              (BYTE *)plVar49,(BYTE *)iStart);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_00635624;
          if (0x20000 < seqStore->maxNbLit) goto LAB_00635681;
          plVar47 = (long *)((long)plVar47 + 1);
          uVar38 = (long)plVar47 - (long)local_130;
          plVar49 = (long *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar49 + uVar38))
          goto LAB_00635643;
          if (iEnd < plVar47) goto LAB_00635662;
          if (plVar21 < plVar47) {
            ZSTD_safecopyLiterals((BYTE *)plVar49,(BYTE *)local_130,(BYTE *)plVar47,(BYTE *)plVar21)
            ;
LAB_00632dbd:
            seqStore->lit = seqStore->lit + uVar38;
            if (0xffff < uVar38) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00635779;
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            lVar29 = local_130[1];
            *plVar49 = *local_130;
            plVar49[1] = lVar29;
            pBVar35 = seqStore->lit;
            if (0x10 < uVar38) {
              if ((ulong)((long)(pBVar35 + 0x10) + (-0x10 - (long)(local_130 + 2))) <
                  0xffffffffffffffe1) {
                lVar29 = local_130[3];
                *(long *)(pBVar35 + 0x10) = local_130[2];
                *(long *)(pBVar35 + 0x18) = lVar29;
                if (0x20 < (long)uVar38) {
                  lVar29 = 0;
                  do {
                    puVar3 = (undefined8 *)((long)local_130 + lVar29 + 0x20);
                    uVar17 = puVar3[1];
                    pBVar2 = pBVar35 + lVar29 + 0x20;
                    *(undefined8 *)pBVar2 = *puVar3;
                    *(undefined8 *)(pBVar2 + 8) = uVar17;
                    puVar3 = (undefined8 *)((long)local_130 + lVar29 + 0x30);
                    uVar17 = puVar3[1];
                    *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                    *(undefined8 *)(pBVar2 + 0x18) = uVar17;
                    lVar29 = lVar29 + 0x20;
                  } while (pBVar2 + 0x20 < pBVar35 + uVar38);
                }
                goto LAB_00632dbd;
              }
              goto LAB_00635798;
            }
            seqStore->lit = pBVar35 + uVar38;
          }
          uVar28 = sVar23 + 4;
          psVar31 = seqStore->sequences;
          psVar31->litLength = (U16)uVar38;
          psVar31->offBase = 1;
          if (uVar28 < 3) goto LAB_006356a0;
          uVar38 = sVar23 + 1;
          if (0xffff < uVar38) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_006356de;
LAB_0063322b:
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar31 - (long)seqStore->sequencesStart) >> 3);
          }
LAB_00633250:
          plVar47 = (long *)(uVar28 + (long)plVar47);
          psVar31->mlBase = (U16)uVar38;
          psVar31 = psVar31 + 1;
          seqStore->sequences = psVar31;
          local_130 = plVar47;
          if (plVar47 <= plVar20) {
            uVar41 = UVar44 + 2;
            lVar29 = *(long *)(pBVar9 + uVar41);
            pUVar14[(ulong)(lVar29 * -0x30e44323485a9b9d) >> (bVar26 & 0x3f)] = uVar41;
            pUVar14[(ulong)(*(long *)((long)plVar47 + -2) * -0x30e44323485a9b9d) >> (bVar26 & 0x3f)]
                 = ((int)plVar47 + -2) - iVar39;
            pUVar15[(ulong)(lVar29 * -0x30e4432340650000) >> (bVar27 & 0x3f)] = uVar41;
            pUVar15[(ulong)(*(long *)((long)plVar47 + -1) * -0x30e4432340650000) >> (bVar27 & 0x3f)]
                 = ((int)plVar47 + -1) - iVar39;
            uVar41 = local_124;
            for (; local_124 = uVar41, local_130 = plVar47, plVar47 <= plVar20;
                plVar47 = (long *)((long)plVar47 + sVar23 + 4)) {
              UVar44 = (int)plVar47 - iVar39;
              uVar41 = UVar44 - local_124;
              pBVar35 = pBVar9;
              if (uVar41 < uVar16) {
                pBVar35 = pBVar11 + -uVar33;
              }
              if (((uVar16 - 1) - uVar41 < 3) || (*(int *)(pBVar35 + uVar41) != (int)*plVar47))
              break;
              plVar49 = iEnd;
              if (uVar41 < uVar16) {
                plVar49 = mEnd;
              }
              sVar23 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar47 + 4),(BYTE *)((long)(pBVar35 + uVar41) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)plVar49,(BYTE *)iStart);
              if (seqStore->maxNbSeq <= (ulong)((long)psVar31 - (long)seqStore->sequencesStart >> 3)
                 ) goto LAB_00635624;
              if (0x20000 < seqStore->maxNbLit) goto LAB_00635681;
              plVar49 = (long *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < plVar49) goto LAB_00635643;
              if (iEnd < plVar47) goto LAB_00635662;
              if (plVar21 < plVar47) {
                ZSTD_safecopyLiterals
                          ((BYTE *)plVar49,(BYTE *)plVar47,(BYTE *)plVar47,(BYTE *)plVar21);
              }
              else {
                lVar29 = plVar47[1];
                *plVar49 = *plVar47;
                plVar49[1] = lVar29;
              }
              psVar31 = seqStore->sequences;
              psVar31->litLength = 0;
              psVar31->offBase = 1;
              if (sVar23 + 4 < 3) goto LAB_006356a0;
              if (0xffff < sVar23 + 1) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_006356de;
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar31 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar31->mlBase = (U16)(sVar23 + 1);
              psVar31 = psVar31 + 1;
              seqStore->sequences = psVar31;
              lVar29 = *plVar47;
              pUVar15[(ulong)(lVar29 * -0x30e4432340650000) >> (bVar27 & 0x3f)] = UVar44;
              pUVar14[(ulong)(lVar29 * -0x30e44323485a9b9d) >> (bVar26 & 0x3f)] = UVar44;
              uVar41 = local_134;
              local_134 = local_124;
            }
          }
        }
        goto LAB_006329e9;
      }
      goto LAB_00634afa;
    }
  }
  else if (uVar37 == 7) {
    if (uVar42 < uVar41) {
LAB_0063571c:
      __assert_fail("ms->window.dictLimit + (1U << cParams->windowLog) >= endIndex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_double_fast.c"
                    ,0x15a,
                    "size_t ZSTD_compressBlock_doubleFast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
    if (ms->prefetchCDictTables != 0) {
      for (uVar28 = 0; uVar28 < (ulong)(4L << (bVar24 & 0x3f)); uVar28 = uVar28 + 0x40) {
      }
      for (uVar28 = 0; uVar28 < (ulong)(4L << (bVar25 & 0x3f)); uVar28 = uVar28 + 0x40) {
      }
    }
    if (uVar40 < local_134) {
LAB_0063573b:
      __assert_fail("offset_1 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_double_fast.c"
                    ,0x168,
                    "size_t ZSTD_compressBlock_doubleFast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
    if (local_124 <= uVar40) {
      plVar47 = (long *)((long)src + (ulong)(uVar40 == 0));
      bVar26 = 0x40 - cVar18;
      bVar27 = 0x40 - cVar19;
      plVar21 = iEnd + -4;
      local_130 = (long *)src;
LAB_0063404f:
      if (plVar47 < plVar20) {
        if (0x20 < uVar7) {
LAB_00635605:
          __assert_fail("hBits <= 32",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
        }
        lVar29 = *plVar47;
        uVar28 = (ulong)(lVar29 * -0x30e44323485a9b9d) >> (bVar26 & 0x3f);
        if (0x20 < uVar8) goto LAB_00635605;
        uVar38 = (ulong)(lVar29 * -0x30e44323405a9d00) >> (bVar27 & 0x3f);
        if ((0x20 < uVar4) || (0x20 < uVar1)) goto LAB_00635605;
        uVar36 = (ulong)(lVar29 * -0x30e44323485a9b9d) >> (0x38 - bVar24 & 0x3f);
        uVar22 = (ulong)(lVar29 * -0x30e44323405a9d00) >> (0x38 - bVar25 & 0x3f);
        uVar41 = pUVar12[uVar36 >> 8];
        uVar42 = pUVar13[uVar22 >> 8];
        iVar45 = (int)plVar47;
        UVar44 = iVar45 - iVar39;
        uVar6 = pUVar14[uVar28];
        uVar43 = pUVar15[uVar38];
        UVar46 = UVar44 + 1;
        pUVar15[uVar38] = UVar44;
        uVar37 = UVar46 - local_134;
        pUVar14[uVar28] = UVar44;
        if ((uVar16 - 1) - uVar37 < 3) {
LAB_00634193:
          if (uVar16 < uVar6) {
            plVar49 = (long *)(pBVar9 + uVar6);
            if (*plVar49 != lVar29) goto LAB_00634236;
            sVar23 = ZSTD_count((BYTE *)(plVar47 + 1),(BYTE *)(plVar49 + 1),(BYTE *)iEnd);
            uVar28 = sVar23 + 8;
            uVar43 = iVar45 - (int)plVar49;
            for (; ((iStart < plVar49 && (local_130 < plVar47)) &&
                   (*(char *)((long)plVar47 + -1) == *(char *)((long)plVar49 + -1)));
                plVar47 = (long *)((long)plVar47 + -1)) {
              plVar49 = (long *)((long)plVar49 + -1);
              uVar28 = uVar28 + 1;
            }
            goto LAB_0063471a;
          }
          if ((char)uVar36 == (char)uVar41) {
            uVar41 = uVar41 >> 8;
            plVar49 = (long *)(pBVar11 + uVar41);
            if (mEnd <= plVar49) {
LAB_006356bf:
              __assert_fail("dictMatchL < dictEnd",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_double_fast.c"
                            ,0x198,
                            "size_t ZSTD_compressBlock_doubleFast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                           );
            }
            if ((uVar5 < uVar41) && (*plVar49 == lVar29)) {
              sVar23 = ZSTD_count_2segments
                                 ((BYTE *)(plVar47 + 1),(BYTE *)(plVar49 + 1),(BYTE *)iEnd,
                                  (BYTE *)mEnd,(BYTE *)iStart);
              uVar28 = sVar23 + 8;
              uVar43 = UVar44 - (uVar41 + uVar30);
              for (; ((plVar32 < plVar49 && (local_130 < plVar47)) &&
                     (*(char *)((long)plVar47 + -1) == *(char *)((long)plVar49 + -1)));
                  plVar47 = (long *)((long)plVar47 + -1)) {
                plVar49 = (long *)((long)plVar49 + -1);
                uVar28 = uVar28 + 1;
              }
              goto LAB_0063471a;
            }
          }
LAB_00634236:
          if (uVar16 < uVar43) {
            plVar49 = (long *)(pBVar9 + uVar43);
            if ((int)*plVar49 == (int)*plVar47) {
LAB_0063425b:
              lVar29 = *(long *)((long)plVar47 + 1);
              uVar38 = (ulong)(lVar29 * -0x30e44323485a9b9d) >> (bVar26 & 0x3f);
              uVar28 = (ulong)(lVar29 * -0x30e44323485a9b9d) >> (0x38 - bVar24 & 0x3f);
              plVar48 = (long *)((long)plVar47 + 1);
              uVar41 = pUVar14[uVar38];
              uVar42 = pUVar12[uVar28 >> 8];
              pUVar14[uVar38] = UVar46;
              if (uVar16 < uVar41) {
                plVar50 = (long *)(pBVar9 + uVar41);
                if (*plVar50 != lVar29) goto LAB_0063450d;
                sVar23 = ZSTD_count((BYTE *)((long)plVar47 + 9),(BYTE *)(plVar50 + 1),(BYTE *)iEnd);
                uVar28 = sVar23 + 8;
                uVar43 = (int)plVar48 - (int)plVar50;
                for (; ((plVar47 = plVar48, iStart < plVar50 && (local_130 < plVar48)) &&
                       (*(char *)((long)plVar48 + -1) == *(char *)((long)plVar50 + -1)));
                    plVar48 = (long *)((long)plVar48 + -1)) {
                  plVar50 = (long *)((long)plVar50 + -1);
                  uVar28 = uVar28 + 1;
                }
              }
              else {
                if ((char)uVar28 == (char)uVar42) {
                  uVar42 = uVar42 >> 8;
                  plVar50 = (long *)(pBVar11 + uVar42);
                  if (mEnd <= plVar50) {
LAB_006357b7:
                    __assert_fail("dictMatchL3 < dictEnd",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_double_fast.c"
                                  ,0x1cc,
                                  "size_t ZSTD_compressBlock_doubleFast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                                 );
                  }
                  if ((uVar5 < uVar42) && (*plVar50 == lVar29)) {
                    sVar23 = ZSTD_count_2segments
                                       ((BYTE *)((long)plVar47 + 9),(BYTE *)(plVar50 + 1),
                                        (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
                    uVar28 = sVar23 + 8;
                    uVar43 = UVar46 - (uVar42 + uVar30);
                    for (; ((plVar47 = plVar48, plVar32 < plVar50 && (local_130 < plVar48)) &&
                           (*(char *)((long)plVar48 + -1) == *(char *)((long)plVar50 + -1)));
                        plVar48 = (long *)((long)plVar48 + -1)) {
                      plVar50 = (long *)((long)plVar50 + -1);
                      uVar28 = uVar28 + 1;
                    }
                    goto LAB_0063471a;
                  }
                }
LAB_0063450d:
                if (uVar43 < uVar16) {
                  sVar23 = ZSTD_count_2segments
                                     ((BYTE *)((long)plVar47 + 4),(BYTE *)((long)plVar49 + 4),
                                      (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
                  uVar28 = sVar23 + 4;
                  uVar43 = UVar44 - uVar43;
                  for (; ((plVar32 < plVar49 && (local_130 < plVar47)) &&
                         (*(char *)((long)plVar47 + -1) == *(char *)((long)plVar49 + -1)));
                      plVar47 = (long *)((long)plVar47 + -1)) {
                    plVar49 = (long *)((long)plVar49 + -1);
                    uVar28 = uVar28 + 1;
                  }
                }
                else {
                  sVar23 = ZSTD_count((BYTE *)((long)plVar47 + 4),(BYTE *)((long)plVar49 + 4),
                                      (BYTE *)iEnd);
                  uVar28 = sVar23 + 4;
                  uVar43 = iVar45 - (int)plVar49;
                  for (; ((iStart < plVar49 && (local_130 < plVar47)) &&
                         (*(char *)((long)plVar47 + -1) == *(char *)((long)plVar49 + -1)));
                      plVar47 = (long *)((long)plVar47 + -1)) {
                    plVar49 = (long *)((long)plVar49 + -1);
                    uVar28 = uVar28 + 1;
                  }
                }
              }
LAB_0063471a:
              if (uVar43 == 0) {
LAB_006356fd:
                __assert_fail("(offset)>0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_double_fast.c"
                              ,0x1e4,
                              "size_t ZSTD_compressBlock_doubleFast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                             );
              }
              if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                  seqStore->maxNbSeq) {
                if (seqStore->maxNbLit < 0x20001) {
                  uVar38 = (long)plVar47 - (long)local_130;
                  plVar49 = (long *)seqStore->lit;
                  if ((BYTE *)((long)plVar49 + uVar38) <= seqStore->litStart + seqStore->maxNbLit) {
                    if (plVar47 <= iEnd) {
                      if (plVar21 < plVar47) {
                        ZSTD_safecopyLiterals
                                  ((BYTE *)plVar49,(BYTE *)local_130,(BYTE *)plVar47,(BYTE *)plVar21
                                  );
LAB_00634791:
                        seqStore->lit = seqStore->lit + uVar38;
                        if (0xffff < uVar38) {
                          if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_00635779:
                            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                                          ,0x2b2,
                                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                                         );
                          }
                          seqStore->longLengthType = ZSTD_llt_literalLength;
                          seqStore->longLengthPos =
                               (U32)((ulong)((long)seqStore->sequences -
                                            (long)seqStore->sequencesStart) >> 3);
                        }
                      }
                      else {
                        lVar29 = local_130[1];
                        *plVar49 = *local_130;
                        plVar49[1] = lVar29;
                        pBVar35 = seqStore->lit;
                        if (0x10 < uVar38) {
                          if ((ulong)((long)(pBVar35 + 0x10) + (-0x10 - (long)(local_130 + 2))) <
                              0xffffffffffffffe1) {
                            lVar29 = local_130[3];
                            *(long *)(pBVar35 + 0x10) = local_130[2];
                            *(long *)(pBVar35 + 0x18) = lVar29;
                            if (0x20 < (long)uVar38) {
                              lVar29 = 0;
                              do {
                                puVar3 = (undefined8 *)((long)local_130 + lVar29 + 0x20);
                                uVar17 = puVar3[1];
                                pBVar2 = pBVar35 + lVar29 + 0x20;
                                *(undefined8 *)pBVar2 = *puVar3;
                                *(undefined8 *)(pBVar2 + 8) = uVar17;
                                puVar3 = (undefined8 *)((long)local_130 + lVar29 + 0x30);
                                uVar17 = puVar3[1];
                                *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                                *(undefined8 *)(pBVar2 + 0x18) = uVar17;
                                lVar29 = lVar29 + 0x20;
                              } while (pBVar2 + 0x20 < pBVar35 + uVar38);
                            }
                            goto LAB_00634791;
                          }
LAB_00635798:
                          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                                        ,0xe9,
                                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                                       );
                        }
                        seqStore->lit = pBVar35 + uVar38;
                      }
                      psVar31 = seqStore->sequences;
                      psVar31->litLength = (U16)uVar38;
                      psVar31->offBase = uVar43 + 3;
                      if (2 < uVar28) {
                        uVar38 = uVar28 - 3;
                        if (uVar38 < 0x10000) {
                          local_124 = local_134;
                          local_134 = uVar43;
                          goto LAB_006348b6;
                        }
                        local_124 = local_134;
                        local_134 = uVar43;
                        if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_00634891;
                        goto LAB_006356de;
                      }
LAB_006356a0:
                      __assert_fail("matchLength >= MINMATCH",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                                    ,700,
                                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                                   );
                    }
LAB_00635662:
                    __assert_fail("literals + litLength <= litLimit",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                                  ,0x2a1,
                                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                                 );
                  }
LAB_00635643:
                  __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                                ,0x2a0,
                                "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                               );
                }
LAB_00635681:
                __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                              ,0x29f,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
LAB_00635624:
              __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x29d,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
          }
          else if ((char)uVar22 == (char)uVar42) {
            uVar42 = uVar42 >> 8;
            if ((uVar5 < uVar42) && (*(int *)(pBVar11 + uVar42) == (int)*plVar47)) {
              uVar43 = uVar42 + uVar30;
              plVar49 = (long *)(pBVar11 + uVar42);
              goto LAB_0063425b;
            }
          }
          plVar47 = (long *)((long)plVar47 + ((long)plVar47 - (long)local_130 >> 8) + 1);
        }
        else {
          piVar34 = (int *)(pBVar9 + uVar37);
          if (uVar37 < uVar16) {
            piVar34 = (int *)(pBVar11 + (uVar37 - uVar30));
          }
          if (*piVar34 != *(int *)((long)plVar47 + 1)) goto LAB_00634193;
          plVar49 = iEnd;
          if (uVar37 < uVar16) {
            plVar49 = mEnd;
          }
          sVar23 = ZSTD_count_2segments
                             ((BYTE *)((long)plVar47 + 5),(BYTE *)(piVar34 + 1),(BYTE *)iEnd,
                              (BYTE *)plVar49,(BYTE *)iStart);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_00635624;
          if (0x20000 < seqStore->maxNbLit) goto LAB_00635681;
          plVar47 = (long *)((long)plVar47 + 1);
          uVar38 = (long)plVar47 - (long)local_130;
          plVar49 = (long *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar49 + uVar38))
          goto LAB_00635643;
          if (iEnd < plVar47) goto LAB_00635662;
          if (plVar21 < plVar47) {
            ZSTD_safecopyLiterals((BYTE *)plVar49,(BYTE *)local_130,(BYTE *)plVar47,(BYTE *)plVar21)
            ;
LAB_00634423:
            seqStore->lit = seqStore->lit + uVar38;
            if (0xffff < uVar38) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00635779;
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            lVar29 = local_130[1];
            *plVar49 = *local_130;
            plVar49[1] = lVar29;
            pBVar35 = seqStore->lit;
            if (0x10 < uVar38) {
              if ((ulong)((long)(pBVar35 + 0x10) + (-0x10 - (long)(local_130 + 2))) <
                  0xffffffffffffffe1) {
                lVar29 = local_130[3];
                *(long *)(pBVar35 + 0x10) = local_130[2];
                *(long *)(pBVar35 + 0x18) = lVar29;
                if (0x20 < (long)uVar38) {
                  lVar29 = 0;
                  do {
                    puVar3 = (undefined8 *)((long)local_130 + lVar29 + 0x20);
                    uVar17 = puVar3[1];
                    pBVar2 = pBVar35 + lVar29 + 0x20;
                    *(undefined8 *)pBVar2 = *puVar3;
                    *(undefined8 *)(pBVar2 + 8) = uVar17;
                    puVar3 = (undefined8 *)((long)local_130 + lVar29 + 0x30);
                    uVar17 = puVar3[1];
                    *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                    *(undefined8 *)(pBVar2 + 0x18) = uVar17;
                    lVar29 = lVar29 + 0x20;
                  } while (pBVar2 + 0x20 < pBVar35 + uVar38);
                }
                goto LAB_00634423;
              }
              goto LAB_00635798;
            }
            seqStore->lit = pBVar35 + uVar38;
          }
          uVar28 = sVar23 + 4;
          psVar31 = seqStore->sequences;
          psVar31->litLength = (U16)uVar38;
          psVar31->offBase = 1;
          if (uVar28 < 3) goto LAB_006356a0;
          uVar38 = sVar23 + 1;
          if (0xffff < uVar38) {
            if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_006356de:
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x2bf,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
LAB_00634891:
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar31 - (long)seqStore->sequencesStart) >> 3);
          }
LAB_006348b6:
          plVar47 = (long *)(uVar28 + (long)plVar47);
          psVar31->mlBase = (U16)uVar38;
          psVar31 = psVar31 + 1;
          seqStore->sequences = psVar31;
          local_130 = plVar47;
          if (plVar47 <= plVar20) {
            uVar41 = UVar44 + 2;
            lVar29 = *(long *)(pBVar9 + uVar41);
            pUVar14[(ulong)(lVar29 * -0x30e44323485a9b9d) >> (bVar26 & 0x3f)] = uVar41;
            pUVar14[(ulong)(*(long *)((long)plVar47 + -2) * -0x30e44323485a9b9d) >> (bVar26 & 0x3f)]
                 = ((int)plVar47 + -2) - iVar39;
            pUVar15[(ulong)(lVar29 * -0x30e44323405a9d00) >> (bVar27 & 0x3f)] = uVar41;
            pUVar15[(ulong)(*(long *)((long)plVar47 + -1) * -0x30e44323405a9d00) >> (bVar27 & 0x3f)]
                 = ((int)plVar47 + -1) - iVar39;
            uVar41 = local_124;
            for (; local_124 = uVar41, local_130 = plVar47, plVar47 <= plVar20;
                plVar47 = (long *)((long)plVar47 + sVar23 + 4)) {
              UVar44 = (int)plVar47 - iVar39;
              uVar41 = UVar44 - local_124;
              pBVar35 = pBVar9;
              if (uVar41 < uVar16) {
                pBVar35 = pBVar11 + -uVar33;
              }
              if (((uVar16 - 1) - uVar41 < 3) || (*(int *)(pBVar35 + uVar41) != (int)*plVar47))
              break;
              plVar49 = iEnd;
              if (uVar41 < uVar16) {
                plVar49 = mEnd;
              }
              sVar23 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar47 + 4),(BYTE *)((long)(pBVar35 + uVar41) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)plVar49,(BYTE *)iStart);
              if (seqStore->maxNbSeq <= (ulong)((long)psVar31 - (long)seqStore->sequencesStart >> 3)
                 ) goto LAB_00635624;
              if (0x20000 < seqStore->maxNbLit) goto LAB_00635681;
              plVar49 = (long *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < plVar49) goto LAB_00635643;
              if (iEnd < plVar47) goto LAB_00635662;
              if (plVar21 < plVar47) {
                ZSTD_safecopyLiterals
                          ((BYTE *)plVar49,(BYTE *)plVar47,(BYTE *)plVar47,(BYTE *)plVar21);
              }
              else {
                lVar29 = plVar47[1];
                *plVar49 = *plVar47;
                plVar49[1] = lVar29;
              }
              psVar31 = seqStore->sequences;
              psVar31->litLength = 0;
              psVar31->offBase = 1;
              if (sVar23 + 4 < 3) goto LAB_006356a0;
              if (0xffff < sVar23 + 1) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_006356de;
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar31 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar31->mlBase = (U16)(sVar23 + 1);
              psVar31 = psVar31 + 1;
              seqStore->sequences = psVar31;
              lVar29 = *plVar47;
              pUVar15[(ulong)(lVar29 * -0x30e44323405a9d00) >> (bVar27 & 0x3f)] = UVar44;
              pUVar14[(ulong)(lVar29 * -0x30e44323485a9b9d) >> (bVar26 & 0x3f)] = UVar44;
              uVar41 = local_134;
              local_134 = local_124;
            }
          }
        }
        goto LAB_0063404f;
      }
LAB_00634afa:
      *rep = local_134;
      rep[1] = local_124;
      return (long)iEnd - (long)local_130;
    }
  }
  else {
    if (uVar42 < uVar41) goto LAB_0063571c;
    if (ms->prefetchCDictTables != 0) {
      for (uVar28 = 0; uVar28 < (ulong)(4L << (bVar24 & 0x3f)); uVar28 = uVar28 + 0x40) {
      }
      for (uVar28 = 0; uVar28 < (ulong)(4L << (bVar25 & 0x3f)); uVar28 = uVar28 + 0x40) {
      }
    }
    if (uVar40 < local_134) goto LAB_0063573b;
    if (local_124 <= uVar40) {
      plVar47 = (long *)((long)src + (ulong)(uVar40 == 0));
      bVar26 = 0x40 - cVar18;
      bVar27 = 0x20 - cVar19;
      plVar21 = iEnd + -4;
      local_130 = (long *)src;
LAB_00634bca:
      if (plVar47 < plVar20) {
        if (0x20 < uVar7) goto LAB_00635605;
        lVar29 = *plVar47;
        uVar28 = (ulong)(lVar29 * -0x30e44323485a9b9d) >> (bVar26 & 0x3f);
        if (0x20 < uVar8) goto LAB_00635605;
        uVar41 = (int)lVar29 * -0x61c8864f;
        uVar42 = uVar41 >> (bVar27 & 0x1f);
        if ((0x20 < uVar4) || (0x20 < uVar1)) goto LAB_00635605;
        uVar38 = (ulong)(lVar29 * -0x30e44323485a9b9d) >> (0x38 - bVar24 & 0x3f);
        uVar41 = uVar41 >> (0x18 - bVar25 & 0x1f);
        uVar6 = pUVar12[uVar38 >> 8];
        uVar43 = pUVar13[uVar41 >> 8];
        iVar45 = (int)plVar47;
        UVar46 = iVar45 - iVar39;
        uVar37 = pUVar14[uVar28];
        uVar40 = pUVar15[uVar42];
        UVar44 = UVar46 + 1;
        pUVar15[uVar42] = UVar46;
        uVar42 = UVar44 - local_134;
        pUVar14[uVar28] = UVar46;
        if ((uVar16 - 1) - uVar42 < 3) {
LAB_00634d09:
          if (uVar16 < uVar37) {
            plVar49 = (long *)(pBVar9 + uVar37);
            if (*plVar49 != lVar29) goto LAB_00634db3;
            sVar23 = ZSTD_count((BYTE *)(plVar47 + 1),(BYTE *)(plVar49 + 1),(BYTE *)iEnd);
            uVar28 = sVar23 + 8;
            uVar40 = iVar45 - (int)plVar49;
            for (; ((iStart < plVar49 && (local_130 < plVar47)) &&
                   (*(char *)((long)plVar47 + -1) == *(char *)((long)plVar49 + -1)));
                plVar47 = (long *)((long)plVar47 + -1)) {
              plVar49 = (long *)((long)plVar49 + -1);
              uVar28 = uVar28 + 1;
            }
            goto LAB_0063517d;
          }
          if ((char)uVar38 == (char)uVar6) {
            uVar6 = uVar6 >> 8;
            plVar49 = (long *)(pBVar11 + uVar6);
            if (mEnd <= plVar49) goto LAB_006356bf;
            if ((uVar5 < uVar6) && (*plVar49 == lVar29)) {
              sVar23 = ZSTD_count_2segments
                                 ((BYTE *)(plVar47 + 1),(BYTE *)(plVar49 + 1),(BYTE *)iEnd,
                                  (BYTE *)mEnd,(BYTE *)iStart);
              uVar28 = sVar23 + 8;
              uVar40 = UVar46 - (uVar6 + uVar30);
              for (; ((plVar32 < plVar49 && (local_130 < plVar47)) &&
                     (*(char *)((long)plVar47 + -1) == *(char *)((long)plVar49 + -1)));
                  plVar47 = (long *)((long)plVar47 + -1)) {
                plVar49 = (long *)((long)plVar49 + -1);
                uVar28 = uVar28 + 1;
              }
              goto LAB_0063517d;
            }
          }
LAB_00634db3:
          if (uVar16 < uVar40) {
            plVar49 = (long *)(pBVar9 + uVar40);
            if ((int)*plVar49 == (int)*plVar47) {
LAB_00634dcf:
              lVar29 = *(long *)((long)plVar47 + 1);
              uVar38 = (ulong)(lVar29 * -0x30e44323485a9b9d) >> (bVar26 & 0x3f);
              uVar28 = (ulong)(lVar29 * -0x30e44323485a9b9d) >> (0x38 - bVar24 & 0x3f);
              plVar48 = (long *)((long)plVar47 + 1);
              uVar41 = pUVar14[uVar38];
              uVar42 = pUVar12[uVar28 >> 8];
              pUVar14[uVar38] = UVar44;
              if (uVar16 < uVar41) {
                plVar50 = (long *)(pBVar9 + uVar41);
                if (*plVar50 != lVar29) goto LAB_0063504e;
                sVar23 = ZSTD_count((BYTE *)((long)plVar47 + 9),(BYTE *)(plVar50 + 1),(BYTE *)iEnd);
                uVar28 = sVar23 + 8;
                uVar40 = (int)plVar48 - (int)plVar50;
                for (plVar47 = plVar48;
                    ((iStart < plVar50 && (local_130 < plVar47)) &&
                    (*(char *)((long)plVar47 + -1) == *(char *)((long)plVar50 + -1)));
                    plVar47 = (long *)((long)plVar47 + -1)) {
                  plVar50 = (long *)((long)plVar50 + -1);
                  uVar28 = uVar28 + 1;
                }
              }
              else {
                if ((char)uVar28 == (char)uVar42) {
                  uVar42 = uVar42 >> 8;
                  plVar50 = (long *)(pBVar11 + uVar42);
                  if (mEnd <= plVar50) goto LAB_006357b7;
                  if ((uVar5 < uVar42) && (*plVar50 == lVar29)) {
                    sVar23 = ZSTD_count_2segments
                                       ((BYTE *)((long)plVar47 + 9),(BYTE *)(plVar50 + 1),
                                        (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
                    uVar28 = sVar23 + 8;
                    uVar40 = UVar44 - (uVar42 + uVar30);
                    for (plVar47 = plVar48;
                        ((plVar32 < plVar50 && (local_130 < plVar47)) &&
                        (*(char *)((long)plVar47 + -1) == *(char *)((long)plVar50 + -1)));
                        plVar47 = (long *)((long)plVar47 + -1)) {
                      plVar50 = (long *)((long)plVar50 + -1);
                      uVar28 = uVar28 + 1;
                    }
                    goto LAB_0063517d;
                  }
                }
LAB_0063504e:
                if (uVar40 < uVar16) {
                  sVar23 = ZSTD_count_2segments
                                     ((BYTE *)((long)plVar47 + 4),(BYTE *)((long)plVar49 + 4),
                                      (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
                  uVar28 = sVar23 + 4;
                  uVar40 = UVar46 - uVar40;
                  for (; ((plVar32 < plVar49 && (local_130 < plVar47)) &&
                         (*(char *)((long)plVar47 + -1) == *(char *)((long)plVar49 + -1)));
                      plVar47 = (long *)((long)plVar47 + -1)) {
                    plVar49 = (long *)((long)plVar49 + -1);
                    uVar28 = uVar28 + 1;
                  }
                }
                else {
                  sVar23 = ZSTD_count((BYTE *)((long)plVar47 + 4),(BYTE *)((long)plVar49 + 4),
                                      (BYTE *)iEnd);
                  uVar28 = sVar23 + 4;
                  uVar40 = iVar45 - (int)plVar49;
                  for (; ((iStart < plVar49 && (local_130 < plVar47)) &&
                         (*(char *)((long)plVar47 + -1) == *(char *)((long)plVar49 + -1)));
                      plVar47 = (long *)((long)plVar47 + -1)) {
                    plVar49 = (long *)((long)plVar49 + -1);
                    uVar28 = uVar28 + 1;
                  }
                }
              }
LAB_0063517d:
              if (uVar40 != 0) {
                if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                    seqStore->maxNbSeq) {
                  if (seqStore->maxNbLit < 0x20001) {
                    uVar38 = (long)plVar47 - (long)local_130;
                    plVar49 = (long *)seqStore->lit;
                    if ((BYTE *)((long)plVar49 + uVar38) <= seqStore->litStart + seqStore->maxNbLit)
                    {
                      if (plVar47 <= iEnd) {
                        if (plVar21 < plVar47) {
                          ZSTD_safecopyLiterals
                                    ((BYTE *)plVar49,(BYTE *)local_130,(BYTE *)plVar47,
                                     (BYTE *)plVar21);
LAB_006351fd:
                          seqStore->lit = seqStore->lit + uVar38;
                          if (0xffff < uVar38) {
                            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00635779;
                            seqStore->longLengthType = ZSTD_llt_literalLength;
                            seqStore->longLengthPos =
                                 (U32)((ulong)((long)seqStore->sequences -
                                              (long)seqStore->sequencesStart) >> 3);
                          }
                        }
                        else {
                          lVar29 = local_130[1];
                          *plVar49 = *local_130;
                          plVar49[1] = lVar29;
                          pBVar35 = seqStore->lit;
                          if (0x10 < uVar38) {
                            if ((ulong)((long)(pBVar35 + 0x10) + (-0x10 - (long)(local_130 + 2))) <
                                0xffffffffffffffe1) {
                              lVar29 = local_130[3];
                              *(long *)(pBVar35 + 0x10) = local_130[2];
                              *(long *)(pBVar35 + 0x18) = lVar29;
                              if (0x20 < (long)uVar38) {
                                lVar29 = 0;
                                do {
                                  puVar3 = (undefined8 *)((long)local_130 + lVar29 + 0x20);
                                  uVar17 = puVar3[1];
                                  pBVar2 = pBVar35 + lVar29 + 0x20;
                                  *(undefined8 *)pBVar2 = *puVar3;
                                  *(undefined8 *)(pBVar2 + 8) = uVar17;
                                  puVar3 = (undefined8 *)((long)local_130 + lVar29 + 0x30);
                                  uVar17 = puVar3[1];
                                  *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                                  *(undefined8 *)(pBVar2 + 0x18) = uVar17;
                                  lVar29 = lVar29 + 0x20;
                                } while (pBVar2 + 0x20 < pBVar35 + uVar38);
                              }
                              goto LAB_006351fd;
                            }
                            goto LAB_00635798;
                          }
                          seqStore->lit = pBVar35 + uVar38;
                        }
                        psVar31 = seqStore->sequences;
                        psVar31->litLength = (U16)uVar38;
                        psVar31->offBase = uVar40 + 3;
                        if (2 < uVar28) {
                          uVar38 = uVar28 - 3;
                          if (uVar38 < 0x10000) {
                            local_124 = local_134;
                            local_134 = uVar40;
                            goto LAB_0063535a;
                          }
                          local_124 = local_134;
                          local_134 = uVar40;
                          if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_00635344;
                          goto LAB_006356de;
                        }
                        goto LAB_006356a0;
                      }
                      goto LAB_00635662;
                    }
                    goto LAB_00635643;
                  }
                  goto LAB_00635681;
                }
                goto LAB_00635624;
              }
              goto LAB_006356fd;
            }
          }
          else if ((char)uVar41 == (char)uVar43) {
            uVar43 = uVar43 >> 8;
            if ((uVar5 < uVar43) && (*(int *)(pBVar11 + uVar43) == (int)*plVar47)) {
              uVar40 = uVar43 + uVar30;
              plVar49 = (long *)(pBVar11 + uVar43);
              goto LAB_00634dcf;
            }
          }
          plVar47 = (long *)((long)plVar47 + ((long)plVar47 - (long)local_130 >> 8) + 1);
        }
        else {
          piVar34 = (int *)(pBVar9 + uVar42);
          if (uVar42 < uVar16) {
            piVar34 = (int *)(pBVar11 + (uVar42 - uVar30));
          }
          if (*piVar34 != *(int *)((long)plVar47 + 1)) goto LAB_00634d09;
          plVar49 = iEnd;
          if (uVar42 < uVar16) {
            plVar49 = mEnd;
          }
          sVar23 = ZSTD_count_2segments
                             ((BYTE *)((long)plVar47 + 5),(BYTE *)(piVar34 + 1),(BYTE *)iEnd,
                              (BYTE *)plVar49,(BYTE *)iStart);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_00635624;
          if (0x20000 < seqStore->maxNbLit) goto LAB_00635681;
          plVar47 = (long *)((long)plVar47 + 1);
          uVar38 = (long)plVar47 - (long)local_130;
          plVar49 = (long *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar49 + uVar38))
          goto LAB_00635643;
          if (iEnd < plVar47) goto LAB_00635662;
          if (plVar21 < plVar47) {
            ZSTD_safecopyLiterals((BYTE *)plVar49,(BYTE *)local_130,(BYTE *)plVar47,(BYTE *)plVar21)
            ;
LAB_00634f76:
            seqStore->lit = seqStore->lit + uVar38;
            if (0xffff < uVar38) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00635779;
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            lVar29 = local_130[1];
            *plVar49 = *local_130;
            plVar49[1] = lVar29;
            pBVar35 = seqStore->lit;
            if (0x10 < uVar38) {
              if ((ulong)((long)(pBVar35 + 0x10) + (-0x10 - (long)(local_130 + 2))) <
                  0xffffffffffffffe1) {
                lVar29 = local_130[3];
                *(long *)(pBVar35 + 0x10) = local_130[2];
                *(long *)(pBVar35 + 0x18) = lVar29;
                if (0x20 < (long)uVar38) {
                  lVar29 = 0;
                  do {
                    puVar3 = (undefined8 *)((long)local_130 + lVar29 + 0x20);
                    uVar17 = puVar3[1];
                    pBVar2 = pBVar35 + lVar29 + 0x20;
                    *(undefined8 *)pBVar2 = *puVar3;
                    *(undefined8 *)(pBVar2 + 8) = uVar17;
                    puVar3 = (undefined8 *)((long)local_130 + lVar29 + 0x30);
                    uVar17 = puVar3[1];
                    *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                    *(undefined8 *)(pBVar2 + 0x18) = uVar17;
                    lVar29 = lVar29 + 0x20;
                  } while (pBVar2 + 0x20 < pBVar35 + uVar38);
                }
                goto LAB_00634f76;
              }
              goto LAB_00635798;
            }
            seqStore->lit = pBVar35 + uVar38;
          }
          uVar28 = sVar23 + 4;
          psVar31 = seqStore->sequences;
          psVar31->litLength = (U16)uVar38;
          psVar31->offBase = 1;
          if (uVar28 < 3) goto LAB_006356a0;
          uVar38 = sVar23 + 1;
          if (0xffff < uVar38) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_006356de;
LAB_00635344:
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar31 - (long)seqStore->sequencesStart) >> 3);
          }
LAB_0063535a:
          plVar47 = (long *)(uVar28 + (long)plVar47);
          psVar31->mlBase = (U16)uVar38;
          psVar31 = psVar31 + 1;
          seqStore->sequences = psVar31;
          local_130 = plVar47;
          if (plVar47 <= plVar20) {
            uVar41 = UVar46 + 2;
            pUVar14[(ulong)(*(long *)(pBVar9 + uVar41) * -0x30e44323485a9b9d) >> (bVar26 & 0x3f)] =
                 uVar41;
            pUVar14[(ulong)(*(long *)((long)plVar47 + -2) * -0x30e44323485a9b9d) >> (bVar26 & 0x3f)]
                 = ((int)plVar47 + -2) - iVar39;
            pUVar15[(uint)(*(int *)(pBVar9 + uVar41) * -0x61c8864f) >> (bVar27 & 0x1f)] = uVar41;
            pUVar15[(uint)(*(int *)((long)plVar47 + -1) * -0x61c8864f) >> (bVar27 & 0x1f)] =
                 ((int)plVar47 + -1) - iVar39;
            uVar41 = local_124;
            for (; local_124 = uVar41, local_130 = plVar47, plVar47 <= plVar20;
                plVar47 = (long *)((long)plVar47 + sVar23 + 4)) {
              UVar44 = (int)plVar47 - iVar39;
              uVar41 = UVar44 - local_124;
              pBVar35 = pBVar9;
              if (uVar41 < uVar16) {
                pBVar35 = pBVar11 + -uVar33;
              }
              if (((uVar16 - 1) - uVar41 < 3) || (*(int *)(pBVar35 + uVar41) != (int)*plVar47))
              break;
              plVar49 = iEnd;
              if (uVar41 < uVar16) {
                plVar49 = mEnd;
              }
              sVar23 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar47 + 4),(BYTE *)((long)(pBVar35 + uVar41) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)plVar49,(BYTE *)iStart);
              if (seqStore->maxNbSeq <= (ulong)((long)psVar31 - (long)seqStore->sequencesStart >> 3)
                 ) goto LAB_00635624;
              if (0x20000 < seqStore->maxNbLit) goto LAB_00635681;
              plVar49 = (long *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < plVar49) goto LAB_00635643;
              if (iEnd < plVar47) goto LAB_00635662;
              if (plVar21 < plVar47) {
                ZSTD_safecopyLiterals
                          ((BYTE *)plVar49,(BYTE *)plVar47,(BYTE *)plVar47,(BYTE *)plVar21);
              }
              else {
                lVar29 = plVar47[1];
                *plVar49 = *plVar47;
                plVar49[1] = lVar29;
              }
              psVar31 = seqStore->sequences;
              psVar31->litLength = 0;
              psVar31->offBase = 1;
              if (sVar23 + 4 < 3) goto LAB_006356a0;
              if (0xffff < sVar23 + 1) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_006356de;
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar31 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar31->mlBase = (U16)(sVar23 + 1);
              psVar31 = psVar31 + 1;
              seqStore->sequences = psVar31;
              pUVar15[(uint)((int)*plVar47 * -0x61c8864f) >> (bVar27 & 0x1f)] = UVar44;
              pUVar14[(ulong)(*plVar47 * -0x30e44323485a9b9d) >> (bVar26 & 0x3f)] = UVar44;
              uVar41 = local_134;
              local_134 = local_124;
            }
          }
        }
        goto LAB_00634bca;
      }
      goto LAB_00634afa;
    }
  }
  __assert_fail("offset_2 <= dictAndPrefixLength",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_double_fast.c"
                ,0x169,
                "size_t ZSTD_compressBlock_doubleFast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
               );
}

Assistant:

size_t ZSTD_compressBlock_doubleFast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_4(ms, seqStore, rep, src, srcSize);
    case 5 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_5(ms, seqStore, rep, src, srcSize);
    case 6 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_6(ms, seqStore, rep, src, srcSize);
    case 7 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_7(ms, seqStore, rep, src, srcSize);
    }
}